

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

void __thiscall
Rml::FontEffectGlowInstancer::~FontEffectGlowInstancer(FontEffectGlowInstancer *this)

{
  FontEffectGlowInstancer *this_local;
  
  ~FontEffectGlowInstancer(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

SharedPtr<FontEffect> FontEffectGlowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	int width_outline = properties.GetProperty(id_width_outline)->Get<int>();
	int width_blur = properties.GetProperty(id_width_blur)->Get<int>();
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	if (width_blur < 0)
		width_blur = width_outline;

	auto font_effect = MakeShared<FontEffectGlow>();
	if (font_effect->Initialise(width_outline, width_blur, offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}